

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRunner.h
# Opt level: O0

int __thiscall
UnitTest::TestRunner::RunTestsIf<UnitTest::True>
          (TestRunner *this,TestList *list,char *suiteName,True *predicate,int maxTestTimeInMs)

{
  bool bVar1;
  int iVar2;
  Test *local_38;
  Test *curTest;
  int maxTestTimeInMs_local;
  True *predicate_local;
  char *suiteName_local;
  TestList *list_local;
  TestRunner *this_local;
  
  for (local_38 = TestList::GetHead(list); local_38 != (Test *)0x0; local_38 = local_38->next) {
    bVar1 = IsTestInSuite(this,local_38,suiteName);
    if ((bVar1) && (bVar1 = True::operator()(predicate,local_38), bVar1)) {
      RunTest(this,this->m_result,local_38,maxTestTimeInMs);
    }
  }
  iVar2 = Finish(this);
  return iVar2;
}

Assistant:

int RunTestsIf(TestList const& list, char const* suiteName, 
				   const Predicate& predicate, int maxTestTimeInMs) const
	{
	    Test* curTest = list.GetHead();

	    while (curTest != 0)
	    {
		    if (IsTestInSuite(curTest, suiteName) && predicate(curTest))
				RunTest(m_result, curTest, maxTestTimeInMs);

			curTest = curTest->next;
	    }

	    return Finish();
	}